

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O2

float __thiscall KV::KeyValues::getValueAsFloat(KeyValues *this,float defaultVal)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  if ((this->value).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    __str = std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value(&this->value);
    defaultVal = std::__cxx11::stof(__str,(size_t *)0x0);
  }
  return defaultVal;
}

Assistant:

float KeyValues::getValueAsFloat( float defaultVal /*= 0.0f*/ ) const
	{
		if ( !value )
			return defaultVal;

		try
		{
			return std::stof( value.value() );
		}
		catch ( const std::exception& )
		{
			return defaultVal;
		}
	}